

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O2

int SaveEXR(Vector *img,int w,int h,string *filename)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  size_type __new_size;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  double *pdVar7;
  char *err;
  vector<float,_std::allocator<float>_> images [3];
  float *image_ptr [3];
  char *names [3];
  EXRImage image;
  
  image.requested_pixel_types = (int *)0x0;
  image.channel_names = (char **)0x0;
  image.images = (uchar **)0x0;
  image.pixel_types = (int *)0x0;
  image.compression = 3;
  image.num_custom_attributes = 0;
  image.num_channels = 3;
  names[2] = "R";
  names[0] = "B";
  names[1] = "G";
  images[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  images[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  images[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  images[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  images[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  images[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  images[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  images[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  images[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  uVar5 = h * w;
  __new_size = (size_type)(int)uVar5;
  std::vector<float,_std::allocator<float>_>::resize(images,__new_size);
  std::vector<float,_std::allocator<float>_>::resize(images + 1,__new_size);
  std::vector<float,_std::allocator<float>_>::resize(images + 2,__new_size);
  uVar4 = 0;
  uVar3 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar3 = uVar4;
  }
  pdVar7 = &img->z;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    images[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar4] = (float)((Vector *)(pdVar7 + -2))->x;
    images[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar4] = (float)pdVar7[-1];
    images[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar4] = (float)*pdVar7;
    pdVar7 = pdVar7 + 3;
  }
  image_ptr[0] = std::vector<float,_std::allocator<float>_>::at(images + 2,0);
  image_ptr[1] = std::vector<float,_std::allocator<float>_>::at(images + 1,0);
  image_ptr[2] = std::vector<float,_std::allocator<float>_>::at(images,0);
  image.images = (uchar **)image_ptr;
  image.channel_names = names;
  image.compression = 3;
  image.width = w;
  image.height = h;
  piVar2 = (int *)malloc(0xc);
  image.pixel_types = piVar2;
  image.requested_pixel_types = (int *)malloc(0xc);
  for (uVar3 = 0; uVar3 < 3; uVar3 = uVar3 + 1) {
    piVar2[uVar3] = 2;
    image.requested_pixel_types[uVar3] = 1;
  }
  iVar1 = SaveMultiChannelEXRToFile(&image,(filename->_M_dataplus)._M_p,&err);
  if (iVar1 != 0) {
    fprintf(_stderr,"Save EXR err: %s\n",err);
  }
  free(image.pixel_types);
  free(image.requested_pixel_types);
  lVar6 = 0x30;
  do {
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)
               ((long)&images[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  return iVar1;
}

Assistant:

int SaveEXR(const Vector* img, int w, int h, const std::string& filename) {
   EXRImage image;
   InitEXRImage(&image);
   image.num_channels  = 3;
   const char* names[] = {"B", "G", "R"};

    std::vector<float> images[3];
    images[0].resize(w * h);
    images[1].resize(w * h);
    images[2].resize(w * h);

    for (int i = 0; i < w * h; i++) {
      images[0][i] = img[i].x;
      images[1][i] = img[i].y;
      images[2][i] = img[i].z;
    }

    float* image_ptr[3];
    image_ptr[0] = &(images[2].at(0)); // B
    image_ptr[1] = &(images[1].at(0)); // G
    image_ptr[2] = &(images[0].at(0)); // R

    image.channel_names = names;
    image.images = (unsigned char**)image_ptr;
    image.width = w;
    image.height = h;
    image.compression = TINYEXR_COMPRESSIONTYPE_ZIP;

    image.pixel_types = (int *)malloc(sizeof(int) * image.num_channels);
    image.requested_pixel_types = (int *)malloc(sizeof(int) * image.num_channels);
    for (int i = 0; i < image.num_channels; i++) {
      image.pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT; // pixel type of input image
      image.requested_pixel_types[i] = TINYEXR_PIXELTYPE_HALF; // pixel type of output image to be stored in .EXR
    }

    const char* err;
    int ret = SaveMultiChannelEXRToFile(&image, filename.c_str(), &err);
    if (ret != 0) {
      fprintf(stderr, "Save EXR err: %s\n", err);
    }

    free(image.pixel_types);
    free(image.requested_pixel_types);
    return ret;
}